

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_timer.c
# Opt level: O2

void oonf_timer_walk(void)

{
  int *piVar1;
  list_entity *plVar2;
  list_entity *timer;
  int iVar3;
  list_entity *plVar4;
  uint64_t end_time;
  uint64_t start_time;
  
  while( true ) {
    timer = _timer_tree.list_head.next;
    if (_timer_tree.count == 0) {
      return;
    }
    plVar2 = _timer_tree.list_head.next[5].prev;
    plVar4 = (list_entity *)oonf_clock_getNow();
    if (plVar4 < plVar2) break;
    if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 1) != 0) {
      oonf_log(1,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x104,0,0,
               "TIMER: fire \'%s\' at clocktick %lu\n",timer[3].prev[1].next,timer[5].prev);
    }
    plVar2 = timer[3].prev;
    plVar2[3].prev = timer;
    *(undefined1 *)&plVar2[4].next = 0;
    piVar1 = (int *)((long)&plVar2[2].prev + 4);
    *piVar1 = *piVar1 + 1;
    if (timer[4].prev == (list_entity *)0x0) {
      oonf_timer_stop((oonf_timer_instance *)timer);
    }
    os_clock_linux_gettime64(&start_time);
    (*(code *)timer[3].prev[1].prev)(timer);
    os_clock_linux_gettime64(&end_time);
    if (100 < end_time - start_time) {
      if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
        oonf_log(4,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x11b,0,0,
                 "Timer %s scheduling took %lu ms",timer[3].prev[1].next,end_time - start_time);
      }
      *(int *)&plVar2[3].next = *(int *)&plVar2[3].next + 1;
    }
    if (*(char *)&plVar2[4].next == '\0') {
      iVar3 = os_core_linux_get_random(timer + 5,4);
      if (iVar3 != 0) {
        if (((&log_global_mask)[_oonf_timer_subsystem.logging] & 4) != 0) {
          oonf_log(4,(ulong)_oonf_timer_subsystem.logging,"src/base/oonf_timer.c",0x129,0,0,
                   "Could not get random data");
        }
        *(undefined4 *)&timer[5].next = 0;
      }
      oonf_timer_start_ext
                ((oonf_timer_instance *)timer,(uint64_t)timer[4].prev,(uint64_t)timer[4].prev);
    }
  }
  return;
}

Assistant:

void
oonf_timer_walk(void) {
  struct oonf_timer_instance *timer;
  struct oonf_timer_class *info;
  uint64_t start_time, end_time;

  _scheduling_now = true;

  while (!avl_is_empty(&_timer_tree)) {
    timer = avl_first_element(&_timer_tree, timer, _node);

    if (timer->_clock > oonf_clock_getNow()) {
      break;
    }

    OONF_DEBUG(LOG_TIMER, "TIMER: fire '%s' at clocktick %" PRIu64 "\n", timer->class->name, timer->_clock);

    /*
     * The timer->info pointer is invalidated by oonf_timer_stop()
     */
    info = timer->class;
    info->_timer_in_callback = timer;
    info->_timer_stopped = false;

    /* update statistics */
    info->_stat_fired++;

    if (timer->_period == 0) {
      /* stop now, the data structure might not be available anymore later */
      oonf_timer_stop(timer);
    }

    /* This timer is expired, call into the provided callback function */
    os_clock_gettime64(&start_time);
    timer->class->callback(timer);
    os_clock_gettime64(&end_time);

    if (end_time - start_time > OONF_TIMER_SLICE) {
      OONF_WARN(LOG_TIMER, "Timer %s scheduling took %" PRIu64 " ms", timer->class->name, end_time - start_time);
      info->_stat_long++;
    }

    /*
     * Only act on actually running timers, the callback might have
     * called oonf_timer_stop() !
     */
    if (!info->_timer_stopped) {
      /*
       * Timer has been not been stopped, so its periodic.
       * rehash the random number and restart.
       */
      if (os_core_get_random(&timer->_random, sizeof(timer->_random))) {
        OONF_WARN(LOG_TIMER, "Could not get random data");
        timer->_random = 0;
      }
      oonf_timer_start(timer, timer->_period);
    }
  }

  _scheduling_now = false;
}